

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.h
# Opt level: O1

bool embree::avx::InstanceArrayIntersectorKMB<8>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  vbool<8> vStack_60;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_40;
  
  uVar1 = 1 << ((byte)k & 0x1f);
  uVar3 = (ulong)((uVar1 & 0xf) << 4);
  local_40._0_8_ = *(undefined8 *)(mm_lookupmask_ps + uVar3);
  local_40._8_8_ = *(undefined8 *)(mm_lookupmask_ps + uVar3 + 8);
  lVar2 = (long)((int)uVar1 >> 4) * 0x10;
  local_40._16_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar2);
  local_40._24_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar2 + 8);
  occluded(&vStack_60,(vbool<8> *)&local_40.field_1,pre,ray,context,prim);
  return *(float *)(ray + k * 4 + 0x100) < 0.0;
}

Assistant:

static __forceinline bool occluded(Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& prim) {
        occluded(vbool<K>(1<<int(k)),pre,ray,context,prim);
        return ray.tfar[k] < 0.0f; 
      }